

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_control.c
# Opt level: O3

void * INT_CMCondition_get_client_data(CManager cm,int condition)

{
  CMCondition p_Var1;
  
  p_Var1 = (CMCondition)&cm->control_list->condition_list;
  set_debug_flag(cm);
  do {
    p_Var1 = p_Var1->next;
    if (p_Var1 == (CMCondition)0x0) {
      fprintf(_stderr,"Serious internal error.  Use of condition %d, no longer in control list\n",
              condition);
      return (void *)0x0;
    }
  } while (p_Var1->condition_num != condition);
  return p_Var1->client_data;
}

Assistant:

extern void *
INT_CMCondition_get_client_data(CManager cm, int condition)
{
    CMCondition cond;
    void *client_data;
    CMControlList cl = cm->control_list;
    set_debug_flag(cm);
    cond = CMCondition_find(cl, condition);
    if (cond) {
	client_data = cond->client_data;
	return client_data;
    } else {
	return NULL;
    }
}